

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O2

void __thiscall
ki::protocol::dml::MessageTemplate::set_handler(MessageTemplate *this,string *handler)

{
  Record *this_00;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar1;
  allocator local_59;
  string local_58 [32];
  string local_38;
  
  this_00 = this->m_record;
  std::__cxx11::string::string((string *)&local_38,"_MsgHandler",&local_59);
  pFVar1 = ki::dml::Record::add_field<std::__cxx11::string>(this_00,&local_38,true);
  std::__cxx11::string::string(local_58,(string *)handler);
  std::__cxx11::string::_M_assign((string *)&pFVar1->m_value);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void MessageTemplate::set_handler(std::string handler)
	{
		m_record->add_field<ki::dml::STR>("_MsgHandler")->set_value(handler);
	}